

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

boundaries __thiscall fmt::v6::internal::fp::assign_float_with_boundaries<double>(fp *this,double d)

{
  boundaries bVar1;
  undefined8 extraout_RDX;
  long *in_RDI;
  fp fVar2;
  fp lower;
  fp upper;
  significand_type half_ulp;
  int min_normal_e;
  bool local_79;
  significand_type local_70;
  char cVar3;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  fp *in_stack_ffffffffffffffa0;
  fp local_50;
  significand_type local_40;
  int local_38;
  ulong local_30;
  undefined4 local_24;
  
  assign<double,_0>(in_stack_ffffffffffffffa0,
                    (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  cVar3 = (char)in_stack_ffffffffffffff98;
  local_24 = 0xffffff4e;
  local_30 = 0x10000000;
  if ((int)in_RDI[1] < -0xb2) {
    local_30 = 0x10000000L << (0x4eU - (char)(int)in_RDI[1] & 0x3f);
  }
  fp(&local_50,*in_RDI + local_30,(int)in_RDI[1]);
  fVar2.f = (ulong)(uint)local_50.e;
  fVar2._8_8_ = extraout_RDX;
  fVar2 = normalize<0>((internal *)local_50.f,fVar2);
  local_40 = fVar2.f;
  local_38 = fVar2.e;
  local_79 = false;
  if (*in_RDI == 0x10000000000000) {
    local_79 = -0xb2 < (int)in_RDI[1];
  }
  fp((fp *)&local_70,*in_RDI - (local_30 >> local_79),(int)in_RDI[1]);
  bVar1.upper = local_40;
  bVar1.lower = local_70 << (cVar3 - (char)local_38 & 0x3fU);
  return bVar1;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }